

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

Vec_Str_t * Fra_SmlSimulateReadFile(char *pFileName)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  FILE *__stream;
  Vec_Str_t *__ptr;
  char *pcVar3;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (Vec_Str_t *)0x0;
    printf("Cannot open file \"%s\" with simulation patterns.\n",pFileName);
  }
  else {
    __ptr = (Vec_Str_t *)malloc(0x10);
    __ptr->nCap = 1000;
    __ptr->nSize = 0;
    pcVar3 = (char *)malloc(1000);
    __ptr->pArray = pcVar3;
    uVar2 = fgetc(__stream);
    while (uVar2 != 0xffffffff) {
      if ((uVar2 & 0xfffffffe) == 0x30) {
        uVar1 = __ptr->nSize;
        if (uVar1 == __ptr->nCap) {
          if ((int)uVar1 < 0x10) {
            if (__ptr->pArray == (char *)0x0) {
              pcVar3 = (char *)malloc(0x10);
            }
            else {
              pcVar3 = (char *)realloc(__ptr->pArray,0x10);
            }
            __ptr->pArray = pcVar3;
            __ptr->nCap = 0x10;
          }
          else {
            __size = (ulong)uVar1 * 2;
            if (__ptr->pArray == (char *)0x0) {
              pcVar3 = (char *)malloc(__size);
            }
            else {
              pcVar3 = (char *)realloc(__ptr->pArray,__size);
            }
            __ptr->pArray = pcVar3;
            __ptr->nCap = (int)__size;
          }
        }
        else {
          pcVar3 = __ptr->pArray;
        }
        __ptr->nSize = uVar1 + 1;
        pcVar3[(int)uVar1] = (char)uVar2 + -0x30;
      }
      else if ((0x20 < uVar2) || ((0x100002600U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
        printf("File \"%s\" contains symbol (%c) other than \'0\' or \'1\'.\n",pFileName,
               (ulong)(uint)(int)(char)uVar2);
        if (__ptr->pArray != (char *)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
        __ptr = (Vec_Str_t *)0x0;
        break;
      }
      uVar2 = fgetc(__stream);
    }
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

Vec_Str_t * Fra_SmlSimulateReadFile( char * pFileName )
{
    Vec_Str_t * vRes;
    FILE * pFile;
    int c;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" with simulation patterns.\n", pFileName );
        return NULL;
    }
    vRes = Vec_StrAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_StrPush( vRes, (char)(c - '0') );
        else if ( c != ' ' && c != '\r' && c != '\n' && c != '\t' )
        {
            printf( "File \"%s\" contains symbol (%c) other than \'0\' or \'1\'.\n", pFileName, (char)c );
            Vec_StrFreeP( &vRes );
            break;
        }
    }
    fclose( pFile );
    return vRes;
}